

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O2

void __thiscall ExprWriter::visit(ExprWriter *this,AsmExpr *expr)

{
  pointer ppVar1;
  bool bVar2;
  ostream *poVar3;
  iterator __begin2;
  pointer ppVar4;
  
  poVar3 = std::operator<<(this->ss,"__asm__(\"");
  poVar3 = std::operator<<(poVar3,(string *)&expr->inst);
  poVar3 = std::operator<<(poVar3,"\"");
  std::endl<char,std::char_traits<char>>(poVar3);
  this->indentCount = this->indentCount + 1;
  indent(this);
  std::operator<<(this->ss,": ");
  ppVar4 = (expr->output).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (expr->output).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    bVar2 = true;
    for (; (ppVar4 != ppVar1 && (ppVar4->second != (Expr *)0x0)); ppVar4 = ppVar4 + 1) {
      if (!bVar2) {
        std::operator<<(this->ss,", ");
      }
      poVar3 = std::operator<<(this->ss,(string *)ppVar4);
      std::operator<<(poVar3," (");
      (*ppVar4->second->_vptr_Expr[2])(ppVar4->second,this);
      std::operator<<(this->ss,")");
      bVar2 = false;
    }
  }
  std::endl<char,std::char_traits<char>>(this->ss);
  indent(this);
  std::operator<<(this->ss,": ");
  ppVar4 = (expr->input).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (expr->input).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    bVar2 = true;
    for (; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
      if (!bVar2) {
        std::operator<<(this->ss,", ");
      }
      poVar3 = std::operator<<(this->ss,(string *)ppVar4);
      std::operator<<(poVar3," (");
      (*ppVar4->second->_vptr_Expr[2])(ppVar4->second,this);
      std::operator<<(this->ss,")");
      bVar2 = false;
    }
  }
  std::endl<char,std::char_traits<char>>(this->ss);
  indent(this);
  std::operator<<(this->ss,": ");
  if ((expr->clobbers)._M_string_length != 0) {
    std::operator<<(this->ss,(string *)&expr->clobbers);
  }
  std::endl<char,std::char_traits<char>>(this->ss);
  this->indentCount = this->indentCount - 1;
  indent(this);
  std::operator<<(this->ss,")");
  return;
}

Assistant:

void ExprWriter::visit(AsmExpr& expr) {
    ss << "__asm__(\"" << expr.inst << "\"" << std::endl;
    indentCount++;
    indent();
    ss << ": ";
    if (!expr.output.empty()) {
        bool first = true;
        for (const auto& out : expr.output) {
            if (!out.second) {
                break;
            }
            if (!first) {
                ss << ", ";
            }
            first = false;

            ss << out.first << " (";
            out.second->accept(*this);
            ss << ")";
        }
    }

    ss << std::endl;
    indent();
    ss << ": ";

    if (!expr.input.empty()) {
        bool first = true;
        for (const auto& in : expr.input) {
            if (!first) {
                ss << ", ";
            }
            first = false;

            ss << in.first << " (";
            in.second->accept(*this);
            ss << ")";
        }
    }

    ss << std::endl;
    indent();
    ss << ": ";

    if (!expr.clobbers.empty()) {
        ss << expr.clobbers;
    }

    ss << std::endl;

    indentCount--;
    indent();
    ss << ")";

}